

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * targetSrcList(Parse *pParse,TriggerStep *pStep)

{
  Schema *pSVar1;
  uint uVar2;
  SrcList *pSVar3;
  char *pcVar4;
  ulong uVar5;
  long *plVar7;
  ulong uVar6;
  
  pSVar3 = sqlite3SrcListAppend((sqlite3 *)pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSVar3 == (SrcList *)0x0) {
    return (SrcList *)0x0;
  }
  pcVar4 = sqlite3DbStrDup((sqlite3 *)pParse,pStep->zTarget);
  pSVar3->a[(long)pSVar3->nSrc + -1].zName = pcVar4;
  pSVar1 = pStep->pTrig->pSchema;
  if (pSVar1 == (Schema *)0x0) {
    uVar6 = 0xfff0bdc0;
  }
  else {
    uVar2 = pParse->nRangeReg;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
      goto LAB_0024daee;
    }
    plVar7 = (long *)(*(long *)&pParse->isMultiWrite + 0x18);
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      if ((Schema *)*plVar7 == pSVar1) break;
      uVar5 = uVar5 + 1;
      plVar7 = plVar7 + 4;
      uVar6 = (ulong)uVar2;
    } while (uVar2 != uVar5);
  }
  uVar2 = (uint)uVar6;
  if (uVar2 != 0 && (int)uVar2 < 2) {
    return pSVar3;
  }
LAB_0024daee:
  pcVar4 = sqlite3DbStrDup((sqlite3 *)pParse,
                           *(char **)(*(long *)&pParse->isMultiWrite + (ulong)uVar2 * 0x20));
  pSVar3->a[(long)pSVar3->nSrc + -1].zDatabase = pcVar4;
  return pSVar3;
}

Assistant:

static SrcList *targetSrcList(
  Parse *pParse,       /* The parsing context */
  TriggerStep *pStep   /* The trigger containing the target token */
){
  sqlite3 *db = pParse->db;
  int iDb;             /* Index of the database to use */
  SrcList *pSrc;       /* SrcList to be returned */

  pSrc = sqlite3SrcListAppend(db, 0, 0, 0);
  if( pSrc ){
    assert( pSrc->nSrc>0 );
    pSrc->a[pSrc->nSrc-1].zName = sqlite3DbStrDup(db, pStep->zTarget);
    iDb = sqlite3SchemaToIndex(db, pStep->pTrig->pSchema);
    if( iDb==0 || iDb>=2 ){
      const char *zDb;
      assert( iDb<db->nDb );
      zDb = db->aDb[iDb].zDbSName;
      pSrc->a[pSrc->nSrc-1].zDatabase =  sqlite3DbStrDup(db, zDb);
    }
  }
  return pSrc;
}